

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O2

size_t tinyusdz::anon_unknown_0::_GetEncodedBufferSize<long>(size_t numInts)

{
  if (numInts != 0) {
    return (numInts * 2 + 7 >> 3) + numInts * 8 + 8;
  }
  return 0;
}

Assistant:

constexpr size_t
_GetEncodedBufferSize(size_t numInts)
{
    // Calculate encoded integer size.
    return numInts ?
        /* commonValue */ (sizeof(Int)) +
        /* numCodesBytes */ ((numInts * 2 + 7) / 8) +
        /* maxIntBytes */ (numInts * sizeof(Int))
        : 0;
}